

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_graph_algorithms.cpp
# Opt level: O1

unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
* __thiscall
geometrycentral::surface::vertexDijkstraDistanceWithinRadius
          (unordered_map<geometrycentral::surface::Vertex,_double,_std::hash<geometrycentral::surface::Vertex>,_std::equal_to<geometrycentral::surface::Vertex>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>_>
           *__return_storage_ptr__,surface *this,IntrinsicGeometryInterface *geom,Vertex startVert,
          double ballRad)

{
  ulong uVar1;
  pointer puVar2;
  Etype firstE_;
  undefined8 uVar3;
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  __node_base_ptr p_Var7;
  mapped_type *pmVar8;
  ParentMeshT *pPVar9;
  ulong *puVar10;
  unsigned_long uVar11;
  byte bVar12;
  ulong uVar13;
  bool bVar14;
  Vertex currVert;
  priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
  toProcess;
  double targetDist;
  Vertex targetVert;
  NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> local_148;
  key_type local_108;
  mapped_type local_f0;
  priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
  local_e8;
  double local_c8;
  double local_c0;
  key_type local_b8;
  NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> local_a8;
  Vertex local_40;
  
  local_40.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
  ind = (size_t)startVert.
                super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                .mesh;
  local_c8 = ballRad;
  local_40.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
  mesh = (ParentMeshT *)geom;
  IntrinsicGeometryInterface::requireEdgeLengths((IntrinsicGeometryInterface *)this);
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_e8.c.
  super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.c.
  super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.c.
  super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.firstE.useImplicitTwin = false;
  local_a8.firstE._1_7_ = 0;
  ::std::
  priority_queue<std::tuple<double,geometrycentral::surface::Vertex>,std::vector<std::tuple<double,geometrycentral::surface::Vertex>,std::allocator<std::tuple<double,geometrycentral::surface::Vertex>>>,std::greater<std::tuple<double,geometrycentral::surface::Vertex>>>
  ::emplace<double,geometrycentral::surface::Vertex&>
            ((priority_queue<std::tuple<double,geometrycentral::surface::Vertex>,std::vector<std::tuple<double,geometrycentral::surface::Vertex>,std::allocator<std::tuple<double,geometrycentral::surface::Vertex>>>,std::greater<std::tuple<double,geometrycentral::surface::Vertex>>>
              *)&local_e8,(double *)&local_a8,&local_40);
  if (local_e8.c.
      super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_e8.c.
      super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_f0 = ((local_e8.c.
                   super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Tuple_impl<0UL,_double,_geometrycentral::surface::Vertex>).
                 super__Head_base<0UL,_double,_false>._M_head_impl;
      local_108.
      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
           ((local_e8.c.
             super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Tuple_impl<0UL,_double,_geometrycentral::surface::Vertex>).
           super__Tuple_impl<1UL,_geometrycentral::surface::Vertex>.
           super__Head_base<1UL,_geometrycentral::surface::Vertex,_false>._M_head_impl.
           super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
           mesh;
      local_108.
      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
           ((local_e8.c.
             super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Tuple_impl<0UL,_double,_geometrycentral::surface::Vertex>).
           super__Tuple_impl<1UL,_geometrycentral::surface::Vertex>.
           super__Head_base<1UL,_geometrycentral::surface::Vertex,_false>._M_head_impl.
           super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
           ind;
      ::std::
      priority_queue<std::tuple<double,_geometrycentral::surface::Vertex>,_std::vector<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>,_std::greater<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
      ::pop(&local_e8);
      p_Var7 = ::std::
               _Hashtable<geometrycentral::surface::Vertex,_std::pair<const_geometrycentral::surface::Vertex,_double>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>,_std::__detail::_Select1st,_std::equal_to<geometrycentral::surface::Vertex>,_std::hash<geometrycentral::surface::Vertex>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::_M_find_before_node
                         (&__return_storage_ptr__->_M_h,
                          local_108.
                          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                          .ind % (__return_storage_ptr__->_M_h)._M_bucket_count,&local_108,
                          local_108.
                          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                          .ind);
      if ((p_Var7 == (__node_base_ptr)0x0) || (p_Var7->_M_nxt == (_Hash_node_base *)0x0)) {
        pmVar8 = ::std::__detail::
                 _Map_base<geometrycentral::surface::Vertex,_std::pair<const_geometrycentral::surface::Vertex,_double>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>,_std::__detail::_Select1st,_std::equal_to<geometrycentral::surface::Vertex>,_std::hash<geometrycentral::surface::Vertex>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<geometrycentral::surface::Vertex,_std::pair<const_geometrycentral::surface::Vertex,_double>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>,_std::__detail::_Select1st,_std::equal_to<geometrycentral::surface::Vertex>,_std::hash<geometrycentral::surface::Vertex>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)__return_storage_ptr__,&local_108);
        *pmVar8 = local_f0;
        local_148.state.currE.currHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
             = ((local_108.
                 super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                .mesh)->vHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start
               [local_108.
                super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                .ind];
        local_148.state.currE.useImplicitTwin =
             (local_108.
              super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
             .mesh)->useImplicitTwinFlag;
        local_148.state.currE.currHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh = local_108.
               super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
               .mesh;
        local_148.state.currE.processingIncoming = false;
        local_148.state.currE.firstHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh._0_1_ = SUB81(local_108.
                           super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                           .mesh,0);
        local_148.state.currE.firstHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh._1_7_ = (undefined7)
                     ((ulong)local_108.
                             super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                             .mesh >> 8);
        local_148.state.currE.firstHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
        ._0_1_ = (undefined1)
                 local_148.state.currE.currHe.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .ind;
        local_148.state.currE.firstHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
        ._1_7_ = (undefined7)
                 (local_148.state.currE.currHe.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  .ind >> 8);
        firstE_.currHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh = local_108.
               super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
               .mesh;
        firstE_.useImplicitTwin =
             (local_108.
              super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
             .mesh)->useImplicitTwinFlag;
        firstE_._1_7_ = local_148.state.currE._1_7_;
        firstE_.currHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
             = local_148.state.currE.currHe.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .ind;
        firstE_._24_8_ = (ulong)(uint7)local_148.state.currE._25_7_ << 8;
        firstE_.firstHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh = local_108.
               super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
               .mesh;
        firstE_.firstHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
             = local_148.state.currE.currHe.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .ind;
        NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::NavigationSetBase
                  (&local_a8,firstE_);
        bVar6 = local_a8.cachedEndIter.justStarted;
        bVar5 = local_a8.cachedEndIter.state.currE.processingIncoming;
        sVar4 = local_a8.cachedEndIter.state.currE.currHe.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .ind;
        local_148.state.currE.useImplicitTwin = local_a8.firstE.useImplicitTwin;
        local_148.state.currE._1_7_ = local_a8.firstE._1_7_;
        uVar3 = local_148.state.currE._0_8_;
        local_148.state.currE.currHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh = local_a8.firstE.currHe.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh;
        local_148.state.currE.firstHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
        ._1_7_ = local_a8.firstE.firstHe.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .ind._1_7_;
        local_148.state.currE._25_7_ = local_a8.firstE._25_7_;
        local_148.state.currE.firstHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh._0_1_ = local_a8.firstE.firstHe.
                     super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                     .mesh._0_1_;
        local_148.state.currE.firstHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
        ._0_1_ = (undefined1)
                 local_a8.firstE.firstHe.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .ind;
        local_148.state.currE.currHe.
        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
             = local_a8.firstE.currHe.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .ind;
        local_148.state.currE.processingIncoming = local_a8.firstE.processingIncoming;
        local_148.justStarted = true;
        local_148.state.currE.useImplicitTwin = local_a8.firstE.useImplicitTwin;
        bVar14 = local_148.state.currE.useImplicitTwin == false;
        pPVar9 = local_a8.firstE.currHe.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .mesh;
        bVar12 = local_a8.firstE.processingIncoming;
        local_148.state.currE._0_8_ = uVar3;
        if (bVar14) {
          do {
            bVar14 = pPVar9->useImplicitTwinFlag;
            if (bVar14 == true) {
              uVar13 = local_148.state.currE.currHe.
                       super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                       .ind >> 1;
            }
            else {
              uVar13 = (pPVar9->heEdgeArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start
                       [local_148.state.currE.currHe.
                        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                        .ind];
            }
            if (bVar14 == false) {
              uVar13 = (pPVar9->eHalfedgeArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar13];
            }
            else {
              uVar13 = uVar13 * 2;
            }
            if (local_148.state.currE.currHe.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .ind == uVar13) goto LAB_001a9351;
            if ((bVar12 & 1) == 0) {
              puVar10 = (pPVar9->heVertOutNextArr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start +
                        local_148.state.currE.currHe.
                        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                        .ind;
              if (bVar14 != false) {
                puVar10 = (pPVar9->heNextArr).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start +
                          (local_148.state.currE.currHe.
                           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                           .ind ^ 1);
              }
              local_148.state.currE.currHe.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .ind = *puVar10;
              uVar13 = CONCAT71(local_148.state.currE.firstHe.
                                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                .ind._1_7_,
                                (undefined1)
                                local_148.state.currE.firstHe.
                                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                .ind);
              if (local_148.state.currE.currHe.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  .ind == uVar13) {
                local_148.state.currE.processingIncoming = true;
                uVar1 = uVar13;
                do {
                  local_148.state.currE.currHe.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  .ind = uVar1;
                  uVar1 = *(ulong *)(*(long *)(CONCAT71(local_a8.firstE.firstHe.
                                                                                                                
                                                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                                  .mesh._1_7_,
                                                  local_148.state.currE.firstHe.
                                                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                                  .mesh._0_1_) + 0xf8) +
                                    local_148.state.currE.currHe.
                                    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                    .ind * 8);
                } while (uVar1 != uVar13);
                bVar12 = 1;
                goto LAB_001a930c;
              }
            }
            else {
              if (bVar14 == false) {
                local_148.state.currE.currHe.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .ind = (pPVar9->heVertInNextArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start
                       [local_148.state.currE.currHe.
                        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                        .ind];
              }
              else {
                local_148.state.currE.currHe.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .ind = (pPVar9->heNextArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start
                       [local_148.state.currE.currHe.
                        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                        .ind] ^ 1;
              }
              if (local_148.state.currE.currHe.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  .ind == CONCAT71(local_148.state.currE.firstHe.
                                   super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                   .ind._1_7_,
                                   (undefined1)
                                   local_148.state.currE.firstHe.
                                   super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                   .ind)) {
                local_148.state.currE.processingIncoming = false;
                local_148.state.currE.currHe.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .ind = *(ulong *)(*(long *)(CONCAT71(local_a8.firstE.firstHe.
                                                                                                          
                                                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                                  .mesh._1_7_,
                                                  local_148.state.currE.firstHe.
                                                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                                  .mesh._0_1_) + 0xf8) +
                                 CONCAT71(local_148.state.currE.firstHe.
                                          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                          .ind._1_7_,
                                          (undefined1)
                                          local_148.state.currE.firstHe.
                                          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                          .ind) * 8);
                bVar12 = 0;
LAB_001a930c:
                pPVar9 = (ParentMeshT *)
                         CONCAT71(local_a8.firstE.firstHe.
                                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                  .mesh._1_7_,
                                  local_148.state.currE.firstHe.
                                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                  .mesh._0_1_);
                local_148.state.currE.firstHe.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .ind._0_1_ = (undefined1)
                             local_148.state.currE.currHe.
                             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                             .ind;
                local_148.state.currE.firstHe.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .ind._1_7_ = (undefined7)
                             (local_148.state.currE.currHe.
                              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                              .ind >> 8);
                local_148.state.currE.currHe.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh = pPVar9;
              }
            }
          } while ((local_148.state.currE.currHe.
                    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                    .ind != local_a8.firstE.currHe.
                            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                            .ind) || ((bool)bVar12 != local_a8.firstE.processingIncoming));
          local_148.justStarted = false;
        }
LAB_001a9351:
        while (((local_148.justStarted != bVar6 ||
                (local_148.state.currE.currHe.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .ind != sVar4)) || (local_148.state.currE.processingIncoming != bVar5))) {
          bVar14 = (local_148.state.currE.currHe.
                    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   .mesh)->useImplicitTwinFlag;
          if (bVar14 == true) {
            uVar13 = local_148.state.currE.currHe.
                     super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                     .ind >> 1;
          }
          else {
            uVar13 = ((local_148.state.currE.currHe.
                       super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                      .mesh)->heEdgeArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [local_148.state.currE.currHe.
                      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                      .ind];
          }
          if (bVar14 == false) {
            uVar11 = ((local_148.state.currE.currHe.
                       super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                      .mesh)->eHalfedgeArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar13];
          }
          else {
            uVar11 = uVar13 * 2;
          }
          puVar2 = ((local_148.state.currE.currHe.
                     super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                    .mesh)->heVertexArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (puVar2[uVar11] ==
              local_108.
              super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
              .ind) {
            if (bVar14 == false) {
              uVar11 = ((local_148.state.currE.currHe.
                         super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                        .mesh)->eHalfedgeArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar13];
            }
            else {
              uVar11 = uVar13 * 2;
            }
            uVar11 = ((local_148.state.currE.currHe.
                       super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                      .mesh)->heNextArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar11];
          }
          else if (bVar14 == false) {
            uVar11 = ((local_148.state.currE.currHe.
                       super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                      .mesh)->eHalfedgeArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar13];
          }
          else {
            uVar11 = uVar13 * 2;
          }
          local_b8.
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
               = puVar2[uVar11];
          local_b8.
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
          mesh = local_148.state.currE.currHe.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .mesh;
          local_c0 = *(double *)(*(long *)(this + 0x380) + uVar13 * 8) + local_f0;
          if ((local_c0 <= local_c8) &&
             ((p_Var7 = ::std::
                        _Hashtable<geometrycentral::surface::Vertex,_std::pair<const_geometrycentral::surface::Vertex,_double>,_std::allocator<std::pair<const_geometrycentral::surface::Vertex,_double>_>,_std::__detail::_Select1st,_std::equal_to<geometrycentral::surface::Vertex>,_std::hash<geometrycentral::surface::Vertex>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::_M_find_before_node
                                  (&__return_storage_ptr__->_M_h,
                                   local_b8.
                                   super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                                   .ind % (__return_storage_ptr__->_M_h)._M_bucket_count,&local_b8,
                                   local_b8.
                                   super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                                   .ind), p_Var7 == (__node_base_ptr)0x0 ||
              (p_Var7->_M_nxt == (_Hash_node_base *)0x0)))) {
            ::std::
            priority_queue<std::tuple<double,geometrycentral::surface::Vertex>,std::vector<std::tuple<double,geometrycentral::surface::Vertex>,std::allocator<std::tuple<double,geometrycentral::surface::Vertex>>>,std::greater<std::tuple<double,geometrycentral::surface::Vertex>>>
            ::emplace<double&,geometrycentral::surface::Vertex&>
                      ((priority_queue<std::tuple<double,geometrycentral::surface::Vertex>,std::vector<std::tuple<double,geometrycentral::surface::Vertex>,std::allocator<std::tuple<double,geometrycentral::surface::Vertex>>>,std::greater<std::tuple<double,geometrycentral::surface::Vertex>>>
                        *)&local_e8,&local_c0,&local_b8);
          }
          NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::operator++
                    (&local_148);
        }
      }
    } while (local_e8.c.
             super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_e8.c.
             super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_e8.c.
      super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.c.
                    super__Vector_base<std::tuple<double,_geometrycentral::surface::Vertex>,_std::allocator<std::tuple<double,_geometrycentral::surface::Vertex>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<Vertex, double> vertexDijkstraDistanceWithinRadius(IntrinsicGeometryInterface& geom,
                                                                      Vertex startVert, double ballRad) {

  // Gather values
  SurfaceMesh& mesh = geom.mesh;
  geom.requireEdgeLengths();

  // Search state: incoming halfedges to each vertex, once discovered
  std::unordered_map<Vertex, double> shortestDist;

  // Search state: visible neighbors eligible to expand to
  using WeightedVertex = std::tuple<double, Vertex>;
  std::priority_queue<WeightedVertex, std::vector<WeightedVertex>, std::greater<WeightedVertex>> toProcess;

  // Add initial source
  toProcess.emplace(0., startVert);

  while (!toProcess.empty()) {

    // Get the next closest neighbor off the queue
    double currDist = std::get<0>(toProcess.top());
    Vertex currVert = std::get<1>(toProcess.top());
    toProcess.pop();

    // skips stale entries
    if (shortestDist.find(currVert) != shortestDist.end()) continue;

    shortestDist[currVert] = currDist;

    for (Edge e : currVert.adjacentEdges()) {
      double len = geom.edgeLengths[e];
      Vertex targetVert = e.otherVertex(currVert);
      double targetDist = currDist + len;

      if (targetDist <= ballRad && shortestDist.find(targetVert) == shortestDist.end()) {
        toProcess.emplace(targetDist, targetVert);
      }
    }
  }

  return shortestDist;
}